

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

int minTemp0_fast(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = 3 << ((byte)iVar & 0x1f);
  uVar3 = (ulong)(uint)nWords;
  iVar2 = nWords * 100 + 0x14;
  while( true ) {
    if ((int)uVar3 < 1) {
      *pDifStart = 0;
      return 0;
    }
    if (0x3f < iVar1) break;
    uVar5 = SFmask[iVar][0] & pInOut[uVar3 - 1];
    uVar4 = (pInOut[uVar3 - 1] & SFmask[iVar][3]) << ((byte)iVar1 & 0x3f);
    iVar2 = iVar2 + -100;
    uVar3 = uVar3 - 1;
    if (uVar5 != uVar4) {
      iVar1 = firstShiftWithOneBit(uVar4 ^ uVar5,1 << ((byte)iVar & 0x1f));
      *pDifStart = iVar2 - iVar1;
      return (uint)(uVar4 <= uVar5) * 3;
    }
  }
  __assert_fail("3*blockSize < 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckyFast16.c"
                ,0x89,"int minTemp0_fast(word *, int, int, int *)");
}

Assistant:

int minTemp0_fast(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, blockSize = 1<<iVar;
    word temp;
    for(i=nWords - 1; i>=0; i--)
    {
        assert( 3*blockSize < 64 );
        temp = ((pInOut[i] & SFmask[iVar][0])) ^ ((pInOut[i] & SFmask[iVar][3])<<(3*blockSize));
        if( temp == 0)
            continue;
        else
        {
            *pDifStart = i*100 + 20 - firstShiftWithOneBit(temp, blockSize);
            if( ((pInOut[i] & SFmask[iVar][0])) < ((pInOut[i] & SFmask[iVar][3])<<(3*blockSize)) )
                return 0;
            else
                return 3;
        }
    }
    *pDifStart=0;
    return 0;

}